

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O2

Vec_Int_t * Seg_ManConvertResult(Seg_Man_t *p)

{
  int Entry1;
  int Entry2;
  int iVar1;
  Vec_Int_t *p_00;
  int v;
  int i;
  
  p_00 = Vec_IntAlloc(1000);
  v = 0;
  i = 1;
  while( true ) {
    if (p->vEdges->nSize <= i) break;
    Entry1 = Vec_IntEntry(p->vEdges,i + -1);
    Entry2 = Vec_IntEntry(p->vEdges,i);
    iVar1 = sat_solver_var_value(p->pSat,v);
    if (iVar1 != 0) {
      Vec_IntPushTwo(p_00,Entry1,Entry2);
    }
    v = v + 1;
    i = i + 2;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Seg_ManConvertResult( Seg_Man_t * p )
{
    int iFanin, iObj, i;
    Vec_Int_t * vEdges2 = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntryDouble( p->vEdges, iFanin, iObj, i )
        if ( sat_solver_var_value(p->pSat, i/2) )
            Vec_IntPushTwo( vEdges2, iFanin, iObj );
    return vEdges2;
}